

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Vector3f __thiscall pbrt::Bounds3<float>::Offset(Bounds3<float> *this,Point3f p)

{
  Tuple3<pbrt::Vector3,_float> TVar1;
  Tuple3<pbrt::Point3,_float> *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  Vector3<float> VVar4;
  Vector3f o;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 local_c;
  float local_4;
  
  vmovlpd_avx(in_ZMM0._0_16_);
  auVar3 = ZEXT856(0);
  VVar4 = Point3<float>::operator-
                    ((Point3<float> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (Point3<float>)*in_RDI);
  local_4 = VVar4.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._0_8_ = VVar4.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar3;
  local_c = vmovlpd_avx(auVar2._0_16_);
  if (in_RDI->x < in_RDI[1].x) {
    local_c._4_4_ = (float)((ulong)local_c >> 0x20);
    local_c = CONCAT44(local_c._4_4_,(float)local_c / (in_RDI[1].x - in_RDI->x));
  }
  if (in_RDI->y < in_RDI[1].y) {
    local_c = CONCAT44(local_c._4_4_ / (in_RDI[1].y - in_RDI->y),(float)local_c);
  }
  if (in_RDI->z < in_RDI[1].z) {
    local_4 = local_4 / (in_RDI[1].z - in_RDI->z);
  }
  TVar1.z = local_4;
  TVar1.x = (float)local_c;
  TVar1.y = local_c._4_4_;
  return (Vector3f)TVar1;
}

Assistant:

PBRT_CPU_GPU
    Vector3f Offset(Point3f p) const {
        Vector3f o = p - pMin;
        if (pMax.x > pMin.x)
            o.x /= pMax.x - pMin.x;
        if (pMax.y > pMin.y)
            o.y /= pMax.y - pMin.y;
        if (pMax.z > pMin.z)
            o.z /= pMax.z - pMin.z;
        return o;
    }